

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

void __thiscall vera::Shader::setUniform(Shader *this,string *_name,int *_array,size_t _size)

{
  uint in_EAX;
  undefined4 uVar1;
  ostream *poVar2;
  long lVar3;
  long *plVar4;
  GLint currentProgram;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  uVar1 = glGetUniformLocation(this->m_program,(_name->_M_dataplus)._M_p);
  uStack_38 = (ulong)(uint)uStack_38;
  glGetIntegerv(0x8b8d,(long)&uStack_38 + 4);
  if (this->m_program != uStack_38._4_4_) {
    return;
  }
  switch(_size) {
  case 1:
    glUniform1i(uVar1,*_array);
    break;
  case 2:
    glUniform2i(uVar1,*_array,_array[1]);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(_name->_M_dataplus)._M_p,_name->_M_string_length);
    uStack_38._0_3_ = CONCAT12(0x2c,(undefined2)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)((long)&uStack_38 + 2),1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*_array);
    uStack_38._0_4_ = CONCAT13(0x2c,(undefined3)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)((long)&uStack_38 + 3),1);
    plVar4 = (long *)std::ostream::operator<<((ostream *)poVar2,_array[1]);
    lVar3 = *plVar4;
    goto LAB_00203c9d;
  case 3:
    glUniform3i(uVar1,*_array,_array[1],_array[2]);
    break;
  case 4:
    glUniform4i(uVar1,*_array,_array[1],_array[2],_array[3]);
    break;
  default:
    plVar4 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Passing matrix uniform as array, not supported yet",0x32);
    lVar3 = std::cerr;
LAB_00203c9d:
    std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Shader::setUniform(const std::string& _name, const int *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1i(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2i(loc, _array[0], _array[1]);
            std::cout << _name << ',' << _array[0] << ',' << _array[1] << std::endl;
        }
        else if (_size == 3) {
            glUniform3i(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4i(loc, _array[0], _array[1], _array[2], _array[3]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}